

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O1

void __thiscall
duckdb::ColumnReader::
PlainSelectTemplatedInternal<duckdb::string_t,duckdb::StringParquetValueConversion,true,true>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          Vector *result,SelectionVector *sel,idx_t approved_tuple_count)

{
  ulong *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  uint64_t uVar5;
  Vector *pVVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  ulong uVar8;
  idx_t idx_in_entry;
  ulong uVar9;
  idx_t row_idx;
  ulong uVar10;
  string_t sVar11;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  uint64_t local_60;
  buffer_ptr<ValidityBuffer> *local_58;
  Vector *local_50;
  data_ptr_t local_48;
  SelectionVector *local_40;
  idx_t local_38;
  
  local_48 = result->data;
  local_60 = num_values;
  local_40 = sel;
  FlatVector::VerifyFlatVector(result);
  if (approved_tuple_count == 0) {
    uVar10 = 0;
  }
  else {
    local_58 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar10 = 0;
    uVar8 = 0;
    local_50 = result;
    do {
      uVar9 = uVar8;
      if (local_40->sel_vector != (sel_t *)0x0) {
        uVar9 = (ulong)local_40->sel_vector[uVar8];
      }
      if (uVar10 < uVar9) {
        do {
          if (this->column_schema->max_define == (ulong)defines[uVar10]) {
            StringParquetValueConversion::PlainSkip<true>(plain_data,this);
          }
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      pVVar6 = local_50;
      if (this->column_schema->max_define == (ulong)defines[uVar9]) {
        sVar11 = StringParquetValueConversion::PlainRead<true>(plain_data,this);
        *(long *)(local_48 + uVar9 * 0x10) = sVar11.value._0_8_;
        *(long *)(local_48 + uVar9 * 0x10 + 8) = sVar11.value._8_8_;
      }
      else {
        if ((local_50->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (local_50->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,&local_38);
          p_Var4 = p_Stack_70;
          peVar3 = local_78;
          local_78 = (element_type *)0x0;
          p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar3;
          (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var4;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
          }
          pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_58);
          (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar7->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar2 = (byte)uVar9 & 0x3f;
        puVar1 = (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar9 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      }
      uVar10 = uVar9 + 1;
      uVar8 = uVar8 + 1;
    } while (uVar8 != approved_tuple_count);
  }
  uVar5 = local_60;
  if (uVar10 < local_60) {
    do {
      if (this->column_schema->max_define == (ulong)defines[uVar10]) {
        StringParquetValueConversion::PlainSkip<true>(plain_data,this);
      }
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  return;
}

Assistant:

void PlainSelectTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines,
	                                  const uint64_t num_values, Vector &result, const SelectionVector &sel,
	                                  idx_t approved_tuple_count) {
		const auto result_ptr = FlatVector::GetData<VALUE_TYPE>(result);
		auto &result_mask = FlatVector::Validity(result);
		idx_t current_entry = 0;
		for (idx_t i = 0; i < approved_tuple_count; i++) {
			auto next_entry = sel.get_index(i);
			D_ASSERT(current_entry <= next_entry);
			// perform any skips forward if required
			PlainSkipTemplatedInternal<CONVERSION, HAS_DEFINES, CHECKED>(plain_data, defines,
			                                                             next_entry - current_entry, current_entry);
			// read this row
			if (HAS_DEFINES && defines[next_entry] != MaxDefine()) {
				result_mask.SetInvalid(next_entry);
			} else {
				result_ptr[next_entry] = CONVERSION::template PlainRead<CHECKED>(plain_data, *this);
			}
			current_entry = next_entry + 1;
		}
		if (current_entry < num_values) {
			// skip forward to the end of where we are selecting
			PlainSkipTemplatedInternal<CONVERSION, HAS_DEFINES, CHECKED>(plain_data, defines,
			                                                             num_values - current_entry, current_entry);
		}
	}